

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Abc_Cex_t * Vta_ManRefineAbstraction(Vta_Man_t *p,int f)

{
  undefined1 *puVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  uint *__ptr;
  void *pvVar12;
  uint *__ptr_00;
  Vec_Int_t *p_00;
  int *piVar13;
  Abc_Cex_t *pAVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  Vta_Obj_t *pVVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  Vta_Obj_t *pVVar25;
  int iVar26;
  Vta_Obj_t *pVVar27;
  long lVar28;
  uint uVar29;
  undefined1 *puVar30;
  int iVar31;
  ulong local_88;
  ulong local_80;
  Vta_Obj_t *local_50;
  uint local_44;
  int *local_40;
  Vta_Obj_t *local_38;
  
  pVVar11 = Vta_ManCollectNodes(p,f);
  uVar20 = (ulong)(uint)pVVar11->nSize;
  if (0 < pVVar11->nSize) {
    lVar28 = 0;
    do {
      piVar13 = pVVar11->pArray;
      iVar10 = piVar13[lVar28];
      lVar24 = (long)iVar10;
      if ((lVar24 < 0) || (p->nObjs <= iVar10)) goto LAB_00583a4b;
      if (iVar10 == 0) goto LAB_0058255a;
      iVar10 = p->pObjs[lVar24].iObj;
      if ((iVar10 < 0) || (p->pGia->nObjs <= iVar10)) goto LAB_005838e1;
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) goto LAB_0058255a;
      pVVar25 = p->pObjs + lVar24;
      uVar22 = *(uint *)&pVVar25->field_0xc;
      *(uint *)&pVVar25->field_0xc = uVar22 | 0xfffffff;
      pVVar27 = p->pObjs;
      if ((pVVar25 <= pVVar27) || (pVVar27 + p->nObjs <= pVVar25)) goto LAB_00583927;
      uVar21 = (uint)((ulong)((long)pVVar25 - (long)pVVar27) >> 4);
      if (((int)uVar21 < 0) || (p->pSat->size <= (int)uVar21)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                      ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
      }
      *(uint *)&pVVar25->field_0xc =
           (uVar22 & 0x4fffffff | 0xfffffff) +
           (uint)(p->pSat->model[uVar21 & 0x7fffffff] == 1) * 0x10000000 + 0x10000000;
      lVar28 = lVar28 + 1;
      uVar20 = (ulong)pVVar11->nSize;
    } while (lVar28 < (long)uVar20);
    if (0 < pVVar11->nSize) {
      piVar13 = pVVar11->pArray;
LAB_0058255a:
      lVar28 = (long)piVar13[(uVar20 & 0xffffffff) - 1];
      if ((lVar28 < 0) || (p->nObjs <= piVar13[(uVar20 & 0xffffffff) - 1])) goto LAB_00583a4b;
      *(uint *)&p->pObjs[lVar28].field_0xc = (*(uint *)&p->pObjs[lVar28].field_0xc & 0xf0000000) + 1
      ;
      __ptr = (uint *)malloc(0x10);
      __ptr[0] = 0x3f7;
      __ptr[1] = 0;
      pvVar12 = malloc(0x1fb8);
      *(void **)(__ptr + 2) = pvVar12;
      __ptr_00 = (uint *)malloc(0x10);
      __ptr_00[0] = 0x3f8;
      __ptr_00[1] = 0;
      pvVar12 = malloc(0x1fc0);
      *(void **)(__ptr_00 + 2) = pvVar12;
      if (0 < (long)pVVar11->nSize) {
        local_88 = 0x3f7;
        uVar21 = 0;
        local_80 = 0x3f8;
        uVar22 = 0;
        uVar20 = (long)pVVar11->nSize;
        do {
          if ((long)pVVar11->nSize < (long)uVar20) goto LAB_0058398d;
          iVar10 = pVVar11->pArray[uVar20 - 1];
          lVar28 = (long)iVar10;
          if ((lVar28 < 0) || (p->nObjs <= iVar10)) goto LAB_00583a4b;
          if (iVar10 == 0) break;
          iVar10 = p->pObjs[lVar28].iObj;
          if (((long)iVar10 < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= iVar10)) goto LAB_005838e1;
          if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
          pVVar27 = p->pObjs + lVar28;
          uVar29 = *(uint *)&pVVar27->field_0xc;
          if ((uVar29 & 0xfffffff) == 0xfffffff) {
            __assert_fail("pThis->Prio < VTA_LARGE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x280,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          pGVar5 = pGVar3->pObjs + iVar10;
          uVar16 = *(ulong *)pGVar5;
          if ((~uVar16 & 0x1fffffff1fffffff) == 0) {
LAB_005826aa:
            *(uint *)&pVVar27->field_0xc = uVar29 & 0xf0000000;
          }
          else {
            uVar18 = (uint)uVar16;
            if ((uVar18 & 0x9fffffff) == 0x9fffffff) {
              uVar18 = (uint)(uVar16 >> 0x20);
              if ((int)(uVar18 & 0x1fffffff) < pGVar3->vCis->nSize - pGVar3->nRegs)
              goto LAB_005826aa;
              if ((int)(uVar18 & 0x1fffffff) < pGVar3->vCis->nSize - pGVar3->nRegs)
              goto LAB_00583aa8;
            }
            else if (((int)uVar18 < 0) || ((uVar18 & 0x1fffffff) == 0x1fffffff)) {
LAB_00583aa8:
              __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x288,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            if ((uVar29 >> 0x1e & 1) == 0) {
              if ((uVar29 & 0xfffffff) == 0) {
                __assert_fail("pThis->Prio > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x28b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              iVar10 = Vta_ManObjIsUsed(p,iVar10);
              if (iVar10 == 0) {
                uVar29 = (uint)local_80;
                if (uVar21 == uVar29) {
                  if ((int)uVar29 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar12 = malloc(0x80);
                    }
                    else {
                      pvVar12 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar12;
                    *__ptr_00 = 0x10;
                    local_80 = 0x10;
                  }
                  else {
                    local_80 = (ulong)(uVar29 * 2);
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar12 = malloc(local_80 * 8);
                    }
                    else {
                      pvVar12 = realloc(*(void **)(__ptr_00 + 2),local_80 * 8);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar12;
                    *__ptr_00 = uVar29 * 2;
                  }
                }
                else {
                  pvVar12 = *(void **)(__ptr_00 + 2);
                }
                lVar28 = (long)(int)uVar21;
                uVar21 = uVar21 + 1;
                __ptr_00[1] = uVar21;
                *(Vta_Obj_t **)((long)pvVar12 + lVar28 * 8) = pVVar27;
              }
              else {
                uVar29 = (uint)local_88;
                if (uVar22 == uVar29) {
                  if ((int)uVar29 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar12 = malloc(0x80);
                    }
                    else {
                      pvVar12 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    *(void **)(__ptr + 2) = pvVar12;
                    *__ptr = 0x10;
                    local_88 = 0x10;
                  }
                  else {
                    local_88 = (ulong)(uVar29 * 2);
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar12 = malloc(local_88 * 8);
                    }
                    else {
                      pvVar12 = realloc(*(void **)(__ptr + 2),local_88 * 8);
                    }
                    *(void **)(__ptr + 2) = pvVar12;
                    *__ptr = uVar29 * 2;
                  }
                }
                else {
                  pvVar12 = *(void **)(__ptr + 2);
                }
                lVar28 = (long)(int)uVar22;
                uVar22 = uVar22 + 1;
                __ptr[1] = uVar22;
                *(Vta_Obj_t **)((long)pvVar12 + lVar28 * 8) = pVVar27;
              }
            }
            else {
              Vta_ObjPreds(p,pVVar27,pGVar5,&local_38,&local_50);
              if (local_38 != (Vta_Obj_t *)0x0) {
                uVar18 = *(uint *)&local_38->field_0xc & 0xfffffff;
                uVar29 = (*(uint *)&pVVar27->field_0xc & 0xfffffff) + 1;
                if (uVar18 < uVar29) {
                  uVar29 = uVar18;
                }
                *(uint *)&local_38->field_0xc = *(uint *)&local_38->field_0xc & 0xf0000000 | uVar29;
              }
              if (local_50 != (Vta_Obj_t *)0x0) {
                uVar18 = *(uint *)&local_50->field_0xc & 0xfffffff;
                uVar29 = (*(uint *)&pVVar27->field_0xc & 0xfffffff) + 1;
                if (uVar18 < uVar29) {
                  uVar29 = uVar18;
                }
                *(uint *)&local_50->field_0xc = *(uint *)&local_50->field_0xc & 0xf0000000 | uVar29;
              }
            }
          }
          bVar8 = 1 < uVar20;
          uVar20 = uVar20 - 1;
        } while (bVar8);
        uVar20 = (ulong)uVar22;
        bVar8 = 0 < (int)uVar22;
        if ((int)uVar22 < 1) {
          bVar8 = false;
        }
        else {
          lVar28 = *(long *)(__ptr + 2);
          uVar16 = 0;
          do {
            puVar4 = *(uint **)(lVar28 + uVar16 * 8);
            puVar4[3] = puVar4[3] & 0xf0000000 | *puVar4 & 0xfffffff;
            uVar16 = uVar16 + 1;
          } while (uVar20 != uVar16);
        }
        uVar16 = (ulong)uVar21;
        bVar9 = 0 < (int)uVar21;
        if ((int)uVar21 < 1) {
          bVar9 = false;
        }
        else {
          lVar28 = *(long *)(__ptr_00 + 2);
          uVar17 = 0;
          do {
            puVar4 = *(uint **)(lVar28 + uVar17 * 8);
            puVar4[3] = puVar4[3] & 0xf0000000 | *puVar4 & 0xfffffff;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        if (1 < (int)uVar22) {
          qsort(*(void **)(__ptr + 2),uVar20,8,Vta_ManComputeDepthIncrease);
        }
        if (1 < (int)uVar21) {
          qsort(*(void **)(__ptr_00 + 2),uVar16,8,Vta_ManComputeDepthIncrease);
        }
        if (1 < (int)uVar22) {
          local_38 = (Vta_Obj_t *)**(long **)(__ptr + 2);
          local_50 = (Vta_Obj_t *)(*(long **)(__ptr + 2))[uVar20 - 1];
          if ((*(uint *)&local_50->field_0xc & 0xfffffff) <
              (*(uint *)&local_38->field_0xc & 0xfffffff)) {
            __assert_fail("pThis0->Prio <= pThis1->Prio",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x2ca,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
        }
        if (bVar8) {
          lVar28 = *(long *)(__ptr + 2);
          uVar17 = 0;
          do {
            lVar24 = *(long *)(lVar28 + uVar17 * 8);
            uVar17 = uVar17 + 1;
            *(uint *)(lVar24 + 0xc) =
                 *(uint *)(lVar24 + 0xc) & 0xf0000000 | (uint)uVar17 & 0xfffffff;
          } while (uVar20 != uVar17);
          iVar10 = (uint)uVar17 + 1;
        }
        else {
          iVar10 = 1;
          bVar8 = false;
        }
        if (bVar9) {
          lVar28 = *(long *)(__ptr_00 + 2);
          uVar17 = 0;
          do {
            lVar24 = *(long *)(lVar28 + uVar17 * 8);
            *(uint *)(lVar24 + 0xc) =
                 *(uint *)(lVar24 + 0xc) & 0xf0000000 | iVar10 + (int)uVar17 & 0xfffffffU;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        uVar16 = (ulong)(uint)pVVar11->nSize;
        if (0 < pVVar11->nSize) {
          lVar28 = 0;
          pVVar27 = local_50;
LAB_00582b2c:
          uVar22 = (uint)uVar16;
          iVar10 = pVVar11->pArray[lVar28];
          lVar24 = (long)iVar10;
          if ((lVar24 < 0) || (uVar21 = p->nObjs, (int)uVar21 <= iVar10)) goto LAB_00583a4b;
          if (iVar10 == 0) goto LAB_00582feb;
          pVVar25 = p->pObjs;
          iVar10 = pVVar25[lVar24].iObj;
          if ((long)iVar10 < 0) goto LAB_005838e1;
          pGVar3 = p->pGia;
          if (pGVar3->nObjs <= iVar10) goto LAB_005838e1;
          pGVar5 = pGVar3->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) goto LAB_00582feb;
          uVar22 = *(uint *)&pVVar25[lVar24].field_0xc;
          if ((int)uVar22 < 0) {
            __assert_fail("pThis->fVisit == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x2d8,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          if ((~uVar22 & 0xfffffff) == 0) {
            __assert_fail("pThis->Prio < VTA_LARGE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x2d9,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          if (0x3fffffff < uVar22) {
            if ((uVar22 & 0x30000000) == 0) {
              __assert_fail("pThis->Value != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x2de,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            uVar16 = *(ulong *)(pGVar5 + iVar10);
            uVar18 = (uint)uVar16;
            uVar29 = (uint)(uVar16 >> 0x20);
            if ((~uVar18 & 0x1fffffff) == 0 || (int)uVar18 < 0) {
              if ((uVar18 & 0x9fffffff) != 0x9fffffff) {
LAB_00582c33:
                if ((~uVar16 & 0x1fffffff1fffffff) != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                ,0x305,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                uVar22 = uVar22 & 0x70000000;
                goto LAB_00582fb6;
              }
              uVar29 = uVar29 & 0x1fffffff;
              iVar10 = pGVar3->vCis->nSize;
              if ((int)uVar29 < iVar10 - pGVar3->nRegs) goto LAB_00582c33;
              iVar26 = pVVar25[lVar24].iFrame;
              if (0 < iVar26) {
                iVar31 = pGVar3->vCos->nSize;
                uVar29 = (iVar31 - iVar10) + uVar29;
                if ((-1 < (int)uVar29) && ((int)uVar29 < iVar31)) {
                  uVar29 = pGVar3->vCos->pArray[uVar29];
                  if ((-1 < (long)(int)uVar29) && (uVar29 < (uint)pGVar3->nObjs)) {
                    iVar10 = uVar29 - (*(uint *)(pGVar5 + (int)uVar29) & 0x1fffffff);
                    uVar29 = p->pBins[(int)((uint)((iVar10 + iVar26) * (iVar10 + iVar26 + -1)) %
                                           (uint)p->nBins)];
                    if ((-1 < (int)uVar29) && (uVar29 < uVar21)) {
                      if (uVar29 == 0) {
LAB_0058394f:
                        __assert_fail("pThis0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                      ,0x2fc,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                     );
                      }
                      while( true ) {
                        if ((pVVar25[uVar29].iObj == iVar10) &&
                           (pVVar25[uVar29].iFrame == iVar26 + -1)) break;
                        uVar29 = pVVar25[uVar29].iNext;
                        if (((int)uVar29 < 0) || ((int)uVar21 <= (int)uVar29)) goto LAB_00583a4b;
                        if (uVar29 == 0) {
                          if ((int)uVar21 < 1) goto LAB_00583a4b;
                          goto LAB_0058394f;
                        }
                      }
                      if ((int)uVar29 < (int)uVar21) {
                        uVar22 = uVar22 & 0x70000000 |
                                 *(uint *)&pVVar25[uVar29].field_0xc & 0xfffffff;
                        goto LAB_00582fb6;
                      }
                    }
                    goto LAB_00583a4b;
                  }
                  goto LAB_005838e1;
                }
                goto LAB_0058398d;
              }
              uVar22 = uVar22 & 0x70000000;
            }
            else {
              iVar31 = iVar10 - (uVar18 & 0x1fffffff);
              iVar26 = pVVar25[lVar24].iFrame;
              uVar15 = p->pBins[(int)((uint)((iVar26 + iVar31 + 1) * (iVar26 + iVar31)) %
                                     (uint)p->nBins)];
              if (((int)uVar15 < 0) || (uVar21 <= uVar15)) goto LAB_00583a4b;
              if (uVar15 != 0) {
                do {
                  if ((pVVar25[uVar15].iObj == iVar31) && (pVVar25[uVar15].iFrame == iVar26)) {
                    if ((int)uVar21 <= (int)uVar15) goto LAB_00583a4b;
                    pVVar19 = pVVar25 + uVar15;
                    goto LAB_00582dd1;
                  }
                  uVar15 = pVVar25[uVar15].iNext;
                  if (((int)uVar15 < 0) || ((int)uVar21 <= (int)uVar15)) goto LAB_00583a4b;
                } while (uVar15 != 0);
                if ((int)uVar21 < 1) goto LAB_00583a4b;
              }
              pVVar19 = (Vta_Obj_t *)0x0;
LAB_00582dd1:
              iVar10 = iVar10 - (uVar29 & 0x1fffffff);
              uVar29 = p->pBins[(int)((uint)((iVar26 + iVar10 + 1) * (iVar26 + iVar10)) %
                                     (uint)p->nBins)];
              if (((int)uVar29 < 0) || (uVar21 <= uVar29)) goto LAB_00583a4b;
              if (uVar29 == 0) {
LAB_005838c2:
                __assert_fail("pThis0 && pThis1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x2e4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              while( true ) {
                if ((pVVar25[uVar29].iObj == iVar10) && (pVVar25[uVar29].iFrame == iVar26)) break;
                uVar29 = pVVar25[uVar29].iNext;
                if (((int)uVar29 < 0) || ((int)uVar21 <= (int)uVar29)) goto LAB_00583a4b;
                if (uVar29 == 0) {
                  if ((int)uVar21 < 1) goto LAB_00583a4b;
                  goto LAB_005838c2;
                }
              }
              if ((int)uVar21 <= (int)uVar29) goto LAB_00583a4b;
              if (pVVar19 == (Vta_Obj_t *)0x0) goto LAB_005838c2;
              pVVar27 = pVVar25 + uVar29;
              uVar21 = uVar22 >> 0x1c & 3;
              if (uVar21 == 1) {
                uVar21 = *(uint *)&pVVar27->field_0xc;
                uVar29 = uVar21 >> 0x1c & 3;
                uVar15 = 2 - ((uVar16 & 0x2000000000000000) == 0);
                if ((*(uint *)&pVVar19->field_0xc >> 0x1c & 3) == ((uVar18 >> 0x1d & 1) != 0) + 1) {
                  uVar18 = *(uint *)&pVVar19->field_0xc & 0xfffffff;
                  if (uVar29 != uVar15) {
                    uVar22 = uVar22 & 0x70000000 | uVar18;
                    goto LAB_00582fb6;
                  }
                  uVar29 = uVar21 & 0xfffffff;
                  if (uVar18 < (uVar21 & 0xfffffff)) {
                    uVar29 = uVar18;
                  }
                }
                else {
                  if (uVar29 != uVar15) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                  ,0x2f2,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                  }
                  uVar29 = uVar21 & 0xfffffff;
                }
                uVar22 = uVar22 & 0x70000000 | uVar29;
              }
              else {
                if (uVar21 != 2) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                ,0x2f4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                if (((*(uint *)&pVVar19->field_0xc >> 0x1c & 3) != 2 - ((uVar18 >> 0x1d & 1) != 0))
                   || ((*(uint *)&pVVar27->field_0xc >> 0x1c & 3) !=
                       ((uVar16 & 0x2000000000000000) == 0) + 1)) {
                  __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                ,0x2e7,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                uVar29 = *(uint *)&pVVar19->field_0xc & 0xfffffff;
                uVar21 = *(uint *)&pVVar27->field_0xc & 0xfffffff;
                if (uVar21 < uVar29) {
                  uVar21 = uVar29;
                }
                uVar22 = uVar22 & 0x70000000 | uVar21;
              }
            }
LAB_00582fb6:
            *(uint *)&pVVar25[lVar24].field_0xc = uVar22;
          }
          lVar28 = lVar28 + 1;
          uVar22 = pVVar11->nSize;
          uVar16 = (ulong)(int)uVar22;
          if ((long)uVar16 <= lVar28) goto LAB_00582feb;
          goto LAB_00582b2c;
        }
      }
    }
  }
  goto LAB_00583a89;
LAB_00582feb:
  local_50 = pVVar27;
  if (0 < (int)uVar22) {
    iVar10 = pVVar11->pArray[(ulong)uVar22 - 1];
    if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_00583a4b:
      __assert_fail("i >= 0 && i < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                    ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
    }
    puVar30 = &p->pObjs[iVar10].field_0xc;
    *(uint *)puVar30 = *(uint *)puVar30 | 0x80000000;
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar13 = (int *)malloc(400);
    p_00->pArray = piVar13;
    lVar28 = (long)pVVar11->nSize;
    if (lVar28 < 1) {
LAB_00583686:
      if (p->pPars->fAddLayer != 0) {
        uVar22 = p_00->nSize;
        if (0 < (long)(int)uVar22) {
          piVar13 = p_00->pArray;
          lVar28 = 0;
          do {
            iVar10 = piVar13[lVar28];
            lVar24 = (long)iVar10;
            if ((lVar24 < 0) || (p->nObjs <= iVar10)) goto LAB_00583a4b;
            if (iVar10 == 0) break;
            uVar21 = *(uint *)&p->pObjs[lVar24].field_0xc;
            if ((int)uVar21 < 0) {
              __assert_fail("pThis->fVisit == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x360,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            *(uint *)&p->pObjs[lVar24].field_0xc = uVar21 | 0x80000000;
            lVar28 = lVar28 + 1;
          } while ((int)uVar22 != lVar28);
        }
        if (bVar8) {
          lVar28 = *(long *)(__ptr + 2);
          uVar16 = 0;
          do {
            pVVar27 = *(Vta_Obj_t **)(lVar28 + uVar16 * 8);
            if (-1 < *(int *)&pVVar27->field_0xc) {
              pVVar25 = p->pObjs;
              if ((pVVar27 <= pVVar25) || (pVVar25 + p->nObjs <= pVVar27)) {
LAB_00583927:
                __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x69,"int Vta_ObjId(Vta_Man_t *, Vta_Obj_t *)");
              }
              Vec_IntPush(p_00,(int)((ulong)((long)pVVar27 - (long)pVVar25) >> 4));
            }
            uVar16 = uVar16 + 1;
          } while (uVar20 != uVar16);
          uVar22 = p_00->nSize;
        }
        if (0 < (int)uVar22) {
          piVar13 = p_00->pArray;
          uVar20 = 0;
          do {
            iVar10 = piVar13[uVar20];
            if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00583a4b;
            if (iVar10 == 0) break;
            puVar1 = &p->pObjs[iVar10].field_0xc;
            *(uint *)puVar1 = *(uint *)puVar1 & 0x7fffffff;
            uVar20 = uVar20 + 1;
          } while (uVar22 != uVar20);
        }
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
      if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 2));
      }
      free(__ptr_00);
      if ((*(uint *)puVar30 & 0xfffffff) == 0) {
        pAVar14 = Vga_ManDeriveCex(p);
        iVar10 = p_00->nSize;
      }
      else {
        iVar10 = p_00->nSize;
        if (0 < (long)iVar10) {
          piVar13 = p_00->pArray;
          lVar28 = 0;
          do {
            iVar26 = piVar13[lVar28];
            lVar24 = (long)iVar26;
            if ((lVar24 < 0) || (p->nObjs <= iVar26)) goto LAB_00583a4b;
            if (iVar26 == 0) break;
            iVar26 = p->pObjs[lVar24].iObj;
            if (((long)iVar26 < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= iVar26)) {
LAB_005838e1:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
            uVar7 = *(undefined8 *)(pGVar3->pObjs + iVar26);
            if ((((uint)uVar7 & 0x9fffffff) != 0x9fffffff) ||
               (pGVar3->vCis->nSize - pGVar3->nRegs <=
                (int)((uint)((ulong)uVar7 >> 0x20) & 0x1fffffff))) {
              Vga_ManAddClausesOne(p,iVar26,p->pObjs[lVar24].iFrame);
            }
            lVar28 = lVar28 + 1;
          } while (iVar10 != lVar28);
        }
        sat_solver2_simplify(p->pSat);
        pAVar14 = (Abc_Cex_t *)0x0;
      }
      p->nObjAdded = p->nObjAdded + iVar10;
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      return pAVar14;
    }
LAB_0058306c:
    if (pVVar11->nSize < lVar28) {
LAB_0058398d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar10 = pVVar11->pArray[lVar28 + -1];
    lVar24 = (long)iVar10;
    if ((lVar24 < 0) || (p->nObjs <= iVar10)) goto LAB_00583a4b;
    if (iVar10 == 0) goto LAB_00583686;
    iVar10 = p->pObjs[lVar24].iObj;
    if (((long)iVar10 < 0) || (p->pGia->nObjs <= iVar10)) goto LAB_005838e1;
    pGVar5 = p->pGia->pObjs;
    if (pGVar5 == (Gia_Obj_t *)0x0) goto LAB_00583686;
    pVVar27 = p->pObjs + lVar24;
    uVar22 = *(uint *)&pVVar27->field_0xc;
    if ((int)uVar22 < 0) {
      *(uint *)&pVVar27->field_0xc = uVar22 & 0x7fffffff;
      uVar21 = uVar22 & 0xfffffff;
      if ((*(uint *)puVar30 & 0xfffffff) < uVar21) {
        __assert_fail("pThis->Prio >= 0 && pThis->Prio <= pTop->Prio",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                      ,0x311,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      pGVar5 = pGVar5 + iVar10;
      if ((uVar22 >> 0x1e & 1) == 0) {
        uVar22 = (uint)*(ulong *)pGVar5;
        if (((int)uVar22 < 0 || (~uVar22 & 0x1fffffff) == 0) &&
           ((~*(ulong *)pGVar5 & 0x1fffffff1fffffff) != 0 && (uVar22 & 0x9fffffff) != 0x9fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                        ,0x315,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        pVVar25 = p->pObjs;
        if ((pVVar27 <= pVVar25) || (pVVar25 + p->nObjs <= pVVar27)) goto LAB_00583927;
        Vec_IntPush(p_00,(int)((ulong)((long)pVVar27 - (long)pVVar25) >> 4));
      }
      else {
        if ((uVar22 & 0x30000000) == 0) {
          __assert_fail("pThis->Value != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                        ,0x31a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        uVar16 = *(ulong *)pGVar5;
        uVar29 = (uint)uVar16;
        pGVar3 = p->pGia;
        uVar18 = (uint)(uVar16 >> 0x20);
        if ((~uVar29 & 0x1fffffff) == 0 || (int)uVar29 < 0) {
          if ((uVar29 & 0x9fffffff) == 0x9fffffff) {
            uVar18 = uVar18 & 0x1fffffff;
            iVar10 = pGVar3->vCis->nSize;
            if (iVar10 - pGVar3->nRegs <= (int)uVar18) {
              iVar26 = pVVar27->iFrame;
              if (iVar26 < 1) goto LAB_0058367c;
              iVar31 = pGVar3->vCos->nSize;
              uVar18 = (iVar31 - iVar10) + uVar18;
              if (((int)uVar18 < 0) || (iVar31 <= (int)uVar18)) goto LAB_0058398d;
              iVar10 = pGVar3->vCos->pArray[uVar18];
              if (((long)iVar10 < 0) || (pGVar3->nObjs <= iVar10)) goto LAB_005838e1;
              iVar10 = iVar10 - (*(uint *)(pGVar3->pObjs + iVar10) & 0x1fffffff);
              uVar22 = p->pBins[(int)((uint)((iVar10 + iVar26) * (iVar10 + iVar26 + -1)) %
                                     (uint)p->nBins)];
              if (((int)uVar22 < 0) || (iVar31 = p->nObjs, iVar31 <= (int)uVar22))
              goto LAB_00583a4b;
              if (uVar22 == 0) {
LAB_00583a2c:
                __assert_fail("pThis0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x352,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              pVVar25 = p->pObjs;
              while( true ) {
                if ((pVVar25[uVar22].iObj == iVar10) && (pVVar25[uVar22].iFrame == iVar26 + -1))
                break;
                uVar22 = pVVar25[uVar22].iNext;
                if (((int)uVar22 < 0) || (iVar31 <= (int)uVar22)) goto LAB_00583a4b;
                if (uVar22 == 0) {
                  if (iVar31 < 1) goto LAB_00583a4b;
                  goto LAB_00583a2c;
                }
              }
              if (iVar31 <= (int)uVar22) goto LAB_00583a4b;
              uVar21 = *(uint *)&pVVar25[uVar22].field_0xc;
              *(uint *)&pVVar25[uVar22].field_0xc = uVar21 | 0x80000000;
              if (((uVar21 ^ *(uint *)&pVVar27->field_0xc) & 0xfffffff) != 0) {
                __assert_fail("pThis0->Prio == pThis->Prio",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x354,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              goto LAB_0058367c;
            }
          }
          if ((~uVar16 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x358,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
        }
        else {
          pGVar6 = pGVar3->pObjs;
          if ((pGVar5 < pGVar6) || (pGVar6 + pGVar3->nObjs <= pGVar5)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar26 = (int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) * -0x55555555;
          iVar31 = iVar26 - (uVar29 & 0x1fffffff);
          iVar10 = pVVar27->iFrame;
          piVar13 = p->pBins;
          uVar15 = p->nBins;
          uVar23 = piVar13[(int)((uint)((iVar10 + iVar31 + 1) * (iVar10 + iVar31)) % uVar15)];
          if (((int)uVar23 < 0) || (uVar2 = p->nObjs, (int)uVar2 <= (int)uVar23)) goto LAB_00583a4b;
          local_44 = uVar15;
          if (uVar23 == 0) {
            pVVar25 = (Vta_Obj_t *)0x0;
          }
          else {
            pVVar25 = p->pObjs;
            do {
              local_40 = piVar13;
              if ((pVVar25[uVar23].iObj == iVar31) && (pVVar25[uVar23].iFrame == iVar10)) {
                if ((int)uVar2 <= (int)uVar23) goto LAB_00583a4b;
                pVVar25 = pVVar25 + uVar23;
                goto LAB_005833e7;
              }
              uVar23 = pVVar25[uVar23].iNext;
              if (((int)uVar23 < 0) || ((int)uVar2 <= (int)uVar23)) goto LAB_00583a4b;
            } while (uVar23 != 0);
            if ((int)uVar2 < 1) goto LAB_00583a4b;
            pVVar25 = (Vta_Obj_t *)0x0;
          }
LAB_005833e7:
          iVar26 = iVar26 - (uVar18 & 0x1fffffff);
          uVar18 = piVar13[(int)((uint)((iVar10 + iVar26 + 1) * (iVar10 + iVar26)) % uVar15)];
          if (((int)uVar18 < 0) || (uVar2 <= uVar18)) goto LAB_00583a4b;
          if (uVar18 == 0) {
LAB_00583908:
            __assert_fail("pThis0 && pThis1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,800,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          pVVar19 = p->pObjs;
          while( true ) {
            if ((pVVar19[uVar18].iObj == iVar26) && (pVVar19[uVar18].iFrame == iVar10)) break;
            uVar18 = pVVar19[uVar18].iNext;
            if (((int)uVar18 < 0) || ((int)uVar2 <= (int)uVar18)) goto LAB_00583a4b;
            if (uVar18 == 0) {
              if ((int)uVar2 < 1) goto LAB_00583a4b;
              goto LAB_00583908;
            }
          }
          if ((int)uVar2 <= (int)uVar18) goto LAB_00583a4b;
          if (pVVar25 == (Vta_Obj_t *)0x0) goto LAB_00583908;
          uVar22 = uVar22 >> 0x1c & 3;
          if (uVar22 == 1) {
            uVar22 = *(uint *)&pVVar25->field_0xc;
            uVar21 = *(uint *)&pVVar19[uVar18].field_0xc;
            uVar23 = uVar21 >> 0x1c & 3;
            uVar15 = 2 - ((uVar16 & 0x2000000000000000) == 0);
            if ((uVar22 >> 0x1c & 3) == ((uVar29 >> 0x1d & 1) != 0) + 1) {
              if (uVar23 == uVar15) {
                if (-1 < (int)(uVar21 | uVar22)) {
                  if ((uVar21 & 0xfffffff) < (uVar22 & 0xfffffff)) {
                    *(uint *)&pVVar19[uVar18].field_0xc = uVar21 | 0x80000000;
                    if (((uVar21 ^ *(uint *)&pVVar27->field_0xc) & 0xfffffff) != 0) {
                      __assert_fail("pThis1->Prio == pThis->Prio",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                    ,0x33b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                    }
                  }
                  else {
                    *(uint *)&pVVar25->field_0xc = uVar22 | 0x80000000;
                    if (((uVar22 ^ *(uint *)&pVVar27->field_0xc) & 0xfffffff) != 0) {
                      __assert_fail("pThis0->Prio == pThis->Prio",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                    ,0x336,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                    }
                  }
                }
              }
              else {
                *(uint *)&pVVar25->field_0xc = uVar22 | 0x80000000;
                if (((uVar22 ^ *(uint *)&pVVar27->field_0xc) & 0xfffffff) != 0) {
                  __assert_fail("pThis0->Prio == pThis->Prio",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                                ,0x341,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
              }
            }
            else {
              if (uVar23 != uVar15) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x348,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              *(uint *)&pVVar19[uVar18].field_0xc = uVar21 | 0x80000000;
              if (((uVar21 ^ *(uint *)&pVVar27->field_0xc) & 0xfffffff) != 0) {
                __assert_fail("pThis1->Prio == pThis->Prio",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x346,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
          }
          else {
            if (uVar22 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x34a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            uVar22 = *(uint *)&pVVar25->field_0xc;
            if (((uVar22 >> 0x1c & 3) != 2 - ((uVar29 >> 0x1d & 1) != 0)) ||
               ((*(uint *)&pVVar19[uVar18].field_0xc >> 0x1c & 3) !=
                ((uVar16 & 0x2000000000000000) == 0) + 1)) {
              __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x323,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            if (uVar21 < (uVar22 & 0xfffffff)) {
              __assert_fail("pThis0->Prio <= pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x324,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            if (uVar21 < (*(uint *)&pVVar19[uVar18].field_0xc & 0xfffffff)) {
              __assert_fail("pThis1->Prio <= pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x325,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            *(uint *)&pVVar25->field_0xc = uVar22 | 0x80000000;
            pVVar19[uVar18].field_0xf = pVVar19[uVar18].field_0xf | 0x80;
          }
        }
      }
    }
LAB_0058367c:
    bVar9 = lVar28 < 2;
    lVar28 = lVar28 + -1;
    if (bVar9) goto LAB_00583686;
    goto LAB_0058306c;
  }
LAB_00583a89:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Vta_ManRefineAbstraction( Vta_Man_t * p, int f )
{
    int fVerify = 0;
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOrder, * vTermsToAdd;
    Vec_Ptr_t * vTermsUsed, * vTermsUnused;
    Vta_Obj_t * pThis, * pThis0, * pThis1, * pTop;
    Gia_Obj_t * pObj;
    int i, Counter;

    if ( fVerify )
    Vta_ManSatVerify( p );

    // collect nodes in a topological order
    vOrder = Vta_ManCollectNodes( p, f );
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        pThis->Prio = VTA_LARGE;
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
        pThis->fVisit = 0;
    }

    // verify
    if ( fVerify )
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }

    // compute distance in reverse order
    pThis = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pThis->Prio  = 1;
    // collect used and unused terms
    vTermsUsed   = Vec_PtrAlloc( 1015 );
    vTermsUnused = Vec_PtrAlloc( 1016 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        // there is no unreachable states
        assert( pThis->Prio < VTA_LARGE );
        // skip constants and PIs
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
        {
            pThis->Prio = 0; // set highest priority
            continue;
        }
        // collect terminals
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
        if ( !pThis->fAdded )
        {
            assert( pThis->Prio > 0 );
            if ( Vta_ManObjIsUsed(p, pThis->iObj) )
                Vec_PtrPush( vTermsUsed, pThis );
            else
                Vec_PtrPush( vTermsUnused, pThis );
            continue;
        }
        // propagate
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) 
            pThis0->Prio = Abc_MinInt( pThis0->Prio, pThis->Prio + 1 );
        if ( pThis1 ) 
            pThis1->Prio = Abc_MinInt( pThis1->Prio, pThis->Prio + 1 );
    }

/*
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
        if ( pThis->Prio > 0 )
            pThis->Prio = 10;
*/
/*
    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
*/


    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = pThis->iObj;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = pThis->iObj;


    // objects with equal distance should receive priority based on number
    // those objects whose prototypes have been added in other timeframes
    // should have higher priority than the current object
    Vec_PtrSort( vTermsUsed,   (int (*)(void))Vta_ManComputeDepthIncrease );
    Vec_PtrSort( vTermsUnused, (int (*)(void))Vta_ManComputeDepthIncrease );
    if ( Vec_PtrSize(vTermsUsed) > 1 )
    {
        pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUsed, 0);
        pThis1 = (Vta_Obj_t *)Vec_PtrEntryLast(vTermsUsed);
        assert( pThis0->Prio <= pThis1->Prio );
    }
    // assign the priority based on these orders
    Counter = 1;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = Counter++;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = Counter++;
//    Abc_Print( 1, "Used %d  Unused %d\n", Vec_PtrSize(vTermsUsed), Vec_PtrSize(vTermsUnused) );


    // propagate in the direct order
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        assert( pThis->Prio < VTA_LARGE );
        // skip terminal objects
        if ( !pThis->fAdded )
            continue;
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                pThis->Prio = Abc_MaxInt( pThis0->Prio, pThis1->Prio );
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = Abc_MinInt( pThis0->Prio, pThis1->Prio ); // choice!!!
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Prio = pThis0->Prio;
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = pThis1->Prio;
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis->Prio = pThis0->Prio;
            }
            else
                pThis->Prio = 0;
        }
        else if ( Gia_ObjIsConst0(pObj) )
            pThis->Prio = 0;
        else
            assert( 0 );
    }

    // select important values
    pTop = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pTop->fVisit = 1;
    vTermsToAdd = Vec_IntAlloc( 100 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fVisit )
            continue;
        pThis->fVisit = 0;
        assert( pThis->Prio >= 0 && pThis->Prio <= pTop->Prio );
        // skip terminal objects
        if ( !pThis->fAdded )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) );
            Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
            continue;
        }
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                assert( pThis0->Prio <= pThis->Prio );
                assert( pThis1->Prio <= pThis->Prio );
                pThis0->fVisit = 1;
                pThis1->fVisit = 1;
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    if ( pThis0->fVisit )
                    {
                    }
                    else if ( pThis1->fVisit )
                    {
                    }
                    else if ( pThis0->Prio <= pThis1->Prio ) // choice!!!
                    {
                        pThis0->fVisit = 1;
                        assert( pThis0->Prio == pThis->Prio );
                    }
                    else
                    {
                        pThis1->fVisit = 1;
                        assert( pThis1->Prio == pThis->Prio );
                    }
                }
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                {
                    pThis0->fVisit = 1;
                    assert( pThis0->Prio == pThis->Prio );
                }
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    pThis1->fVisit = 1;
                    assert( pThis1->Prio == pThis->Prio );
                }
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis0->fVisit = 1;
                assert( pThis0->Prio == pThis->Prio );
            }
        }
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
    }

    if ( p->pPars->fAddLayer )
    {
        // mark those currently included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
        {
            assert( pThis->fVisit == 0 );
            pThis->fVisit = 1;
        }
        // add used terms, which have close relationship
        Counter = Vec_IntSize(vTermsToAdd);
        Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        {
            if ( pThis->fVisit )
                continue;
    //        Vta_ObjPreds( p, pThis, Gia_ManObj(p->pGia, pThis->iObj), &pThis0, &pThis1 );
    //        if ( (pThis0 && (pThis0->fAdded || pThis0->fVisit)) || (pThis1 && (pThis1->fAdded || pThis1->fVisit)) )
                Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
        }
        // remove those currenty included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
            pThis->fVisit = 0;
    }
//    printf( "\n%d -> %d\n", Counter, Vec_IntSize(vTermsToAdd) );
//Vec_IntReverseOrder( vTermsToAdd );
//Vec_IntSort( vTermsToAdd, 1 );


    // cleanup
    Vec_PtrFree( vTermsUsed );
    Vec_PtrFree( vTermsUnused );


    if ( fVerify )
    {
    // verify
    Vta_ManForEachObjVec( vOrder, p, pThis, i )
        pThis->Value = VTA_VARX;
    Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
    {
        assert( !pThis->fAdded );
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
    }
    // simulate 
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        if ( !pThis->fAdded )
            continue;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR1;
            else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR0;
            else
                pThis->Value = VTA_VARX;
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR0;
                else if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR1;
                else
                    pThis->Value = VTA_VARX;
            }
            else
            {
                pThis->Value = VTA_VAR0;
            }
        }
        else if ( Gia_ObjIsConst0(pObj) )
        {
            pThis->Value = VTA_VAR0;
        }
        else assert( 0 );
        // double check the solver
        assert( pThis->Value == VTA_VARX || (int)pThis->Value == (sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0) );
    }

    // check the output
    if ( !Vta_ValIs1(pTop, Gia_ObjFaninC0(Gia_ManPo(p->pGia, 0))) )
        Abc_Print( 1, "Vta_ManRefineAbstraction(): Terminary simulation verification failed!\n" );
//    else
//        Abc_Print( 1, "Verification OK.\n" );
    }


    // produce true counter-example
    if ( pTop->Prio == 0 )
        pCex = Vga_ManDeriveCex( p );
    else
    {
//       Vta_ManProfileAddition( p, vTermsToAdd );

        Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
            if ( !Gia_ObjIsPi(p->pGia, pObj) )
                Vga_ManAddClausesOne( p, pThis->iObj, pThis->iFrame );
        sat_solver2_simplify( p->pSat );
    }
    p->nObjAdded += Vec_IntSize(vTermsToAdd);
    Vec_IntFree( vTermsToAdd );
    return pCex;
}